

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O0

void free_master_msg(EVmaster_msg *msg)

{
  int iVar1;
  long *plVar2;
  int *in_RDI;
  int i_1;
  EVflush_attrs_reconfig_ptr in_1;
  leaf_element *l_1;
  leaf_element *l;
  int i;
  EVnode_join_ptr in;
  int local_34;
  int local_14;
  
  iVar1 = *in_RDI;
  if (iVar1 == 0) {
    free(*(void **)(in_RDI + 4));
    free(*(void **)(in_RDI + 6));
    for (local_14 = 0; local_14 < in_RDI[9]; local_14 = local_14 + 1) {
      plVar2 = (long *)(*(long *)(in_RDI + 10) + (long)local_14 * 0x10);
      if (*plVar2 != 0) {
        free((void *)*plVar2);
      }
      if (plVar2[1] != 0) {
        free((void *)plVar2[1]);
      }
    }
    free(*(void **)(in_RDI + 10));
    for (local_14 = 0; local_14 < in_RDI[8]; local_14 = local_14 + 1) {
      plVar2 = (long *)(*(long *)(in_RDI + 0xc) + (long)local_14 * 0x10);
      if (*plVar2 != 0) {
        free((void *)*plVar2);
      }
      if (plVar2[1] != 0) {
        free((void *)plVar2[1]);
      }
    }
    free(*(void **)(in_RDI + 0xc));
  }
  else if ((2 < iVar1 - 1U) && (iVar1 == 4)) {
    for (local_34 = 0; (long)local_34 < *(long *)(in_RDI + 6); local_34 = local_34 + 1) {
      free(*(void **)(*(long *)(in_RDI + 8) + (long)local_34 * 0x10 + 8));
    }
    free(*(void **)(in_RDI + 8));
  }
  free(in_RDI);
  return;
}

Assistant:

static void
free_master_msg(EVmaster_msg *msg)
{
    switch(msg->msg_type) {
    case DFGnode_join: {
	EVnode_join_ptr in = &msg->u.node_join;
	int i;
	free(in->node_name);
	free(in->contact_string);
	for (i=0; i < in->sink_count; i++) {
	    leaf_element *l = &in->sinks[i];
	    if(l->name) free(l->name);
	    if(l->FMtype) free(l->FMtype);
	}
	free(in->sinks);
	for (i=0; i < in->source_count; i++) {
	    leaf_element *l = &in->sources[i];
	    if (l->name) free(l->name);
	    if (l->FMtype) free(l->FMtype);
	}
	free(in->sources);
	break;
    }
    case DFGflush_reconfig: {
	EVflush_attrs_reconfig_ptr in = &msg->u.flush_reconfig;
	int i;
	for (i=0 ; i < in->count; i++) {
	    free(in->attr_stone_list[i].attr_str);
	}
	free(in->attr_stone_list);
	break;
    }
    case DFGdeploy_ack:
    case DFGshutdown_contrib:
    case DFGconn_shutdown:
    default:
	break;
    }
    free(msg);
}